

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O3

int __thiscall QIODevice::open(QIODevice *this,char *__file,int __oflag,...)

{
  QIODevicePrivate *this_00;
  long lVar1;
  QArrayData *data;
  int iVar2;
  qint64 qVar3;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar4;
  ulong uVar5;
  QArrayDataPointer<QRingChunk> *pQVar6;
  
  this_00 = (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
            super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = (Int)__file;
  if (((ulong)__file & 4) == 0) {
    qVar3 = 0;
  }
  else {
    iVar2 = (*this->_vptr_QIODevice[6])(this,__file,___oflag);
    qVar3 = CONCAT44(extraout_var,iVar2);
  }
  this_00->pos = qVar3;
  this_00->accessMode = Unset;
  lVar1 = (this_00->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  if (0 < lVar1) {
    pQVar6 = (QArrayDataPointer<QRingChunk> *)
             (this_00->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
    uVar5 = lVar1 + 1;
    do {
      QArrayDataPointer<QRingChunk>::~QArrayDataPointer(pQVar6);
      pQVar6 = (QArrayDataPointer<QRingChunk> *)&pQVar6[1].size;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  (this_00->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s = 0;
  lVar1 = (this_00->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  if (0 < lVar1) {
    pQVar6 = (QArrayDataPointer<QRingChunk> *)
             (this_00->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
    uVar5 = lVar1 + 1;
    do {
      QArrayDataPointer<QRingChunk>::~QArrayDataPointer(pQVar6);
      pQVar6 = (QArrayDataPointer<QRingChunk> *)&pQVar6[1].size;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  (this_00->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s = 0;
  QIODevicePrivate::setReadChannelCount
            (this_00,(Int)(((this->d_ptr)._M_t.
                            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>
                            .super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl)->
                          openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                          super_QFlagsStorage<QIODeviceBase::OpenModeFlag> & 1);
  QIODevicePrivate::setWriteChannelCount
            (this_00,(Int)(((this->d_ptr)._M_t.
                            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>
                            .super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl)->
                          openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                          super_QFlagsStorage<QIODeviceBase::OpenModeFlag> >> 1 & 1);
  uVar4 = extraout_RAX;
  if ((this_00->errorString).d.ptr != (char16_t *)0x0) {
    data = &((this_00->errorString).d.d)->super_QArrayData;
    (this_00->errorString).d.d = (Data *)0x0;
    (this_00->errorString).d.ptr = (char16_t *)0x0;
    (this_00->errorString).d.size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
        uVar4 = extraout_RAX_00;
      }
    }
  }
  return (int)CONCAT71((int7)((ulong)uVar4 >> 8),1);
}

Assistant:

bool QIODevice::open(QIODeviceBase::OpenMode mode)
{
    Q_D(QIODevice);
    d->openMode = mode;
    d->pos = (mode & Append) ? size() : qint64(0);
    d->accessMode = QIODevicePrivate::Unset;
    d->readBuffers.clear();
    d->writeBuffers.clear();
    d->setReadChannelCount(isReadable() ? 1 : 0);
    d->setWriteChannelCount(isWritable() ? 1 : 0);
    d->errorString.clear();
#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::open(0x%x)\n", this, mode.toInt());
#endif
    return true;
}